

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphicsplugin_opengl.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1cee2::OpenGLGraphicsPlugin::~OpenGLGraphicsPlugin(OpenGLGraphicsPlugin *this)

{
  _Base_ptr p_Var1;
  
  (this->super_IGraphicsPlugin)._vptr_IGraphicsPlugin =
       (_func_int **)&PTR__OpenGLGraphicsPlugin_00125990;
  if (this->m_swapchainFramebuffer != 0) {
    (*glDeleteFramebuffers)(1,&this->m_swapchainFramebuffer);
  }
  if (this->m_program != 0) {
    (*glDeleteProgram)(this->m_program);
  }
  if (this->m_vao != 0) {
    (*glDeleteVertexArrays)(1,&this->m_vao);
  }
  if (this->m_cubeVertexBuffer != 0) {
    (*glDeleteBuffers)(1,&this->m_cubeVertexBuffer);
  }
  if (this->m_cubeIndexBuffer != 0) {
    (*glDeleteBuffers)(1,&this->m_cubeIndexBuffer);
  }
  for (p_Var1 = (this->m_colorToDepthMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_colorToDepthMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (*(int *)&p_Var1[1].field_0x4 != 0) {
      glDeleteTextures(1,&p_Var1[1].field_0x4);
    }
  }
  ksGpuWindow_Destroy(&this->window);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&(this->m_colorToDepthMap)._M_t);
  std::__cxx11::
  _List_base<std::vector<XrSwapchainImageOpenGLKHR,_std::allocator<XrSwapchainImageOpenGLKHR>_>,_std::allocator<std::vector<XrSwapchainImageOpenGLKHR,_std::allocator<XrSwapchainImageOpenGLKHR>_>_>_>
  ::_M_clear(&(this->m_swapchainImageBuffers).
              super__List_base<std::vector<XrSwapchainImageOpenGLKHR,_std::allocator<XrSwapchainImageOpenGLKHR>_>,_std::allocator<std::vector<XrSwapchainImageOpenGLKHR,_std::allocator<XrSwapchainImageOpenGLKHR>_>_>_>
            );
  return;
}

Assistant:

~OpenGLGraphicsPlugin() override {
        if (m_swapchainFramebuffer != 0) {
            glDeleteFramebuffers(1, &m_swapchainFramebuffer);
        }
        if (m_program != 0) {
            glDeleteProgram(m_program);
        }
        if (m_vao != 0) {
            glDeleteVertexArrays(1, &m_vao);
        }
        if (m_cubeVertexBuffer != 0) {
            glDeleteBuffers(1, &m_cubeVertexBuffer);
        }
        if (m_cubeIndexBuffer != 0) {
            glDeleteBuffers(1, &m_cubeIndexBuffer);
        }

        for (auto& colorToDepth : m_colorToDepthMap) {
            if (colorToDepth.second != 0) {
                glDeleteTextures(1, &colorToDepth.second);
            }
        }

        ksGpuWindow_Destroy(&window);
    }